

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermNode * __thiscall
glslang::TParseContext::addSwitch
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *expression,
          TIntermAggregate *lastStatements)

{
  _List_node_base *p_Var1;
  TIntermediate *this_00;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermBranch *node;
  TIntermAggregate *pTVar4;
  TPoolAllocator *pTVar5;
  undefined4 extraout_var_02;
  TIntermNode *this_01;
  long lVar6;
  TIntermAggregate *local_30;
  
  TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"switch statements");
  TParseVersions::profileRequires((TParseVersions *)this,loc,1,0x82,(char *)0x0,"switch statements")
  ;
  wrapupSwitchSubsequence(this,lastStatements,(TIntermNode *)0x0);
  if ((expression == (TIntermTyped *)0x0) ||
     ((iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x20])(expression), iVar3 != 8 &&
      (iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x20])(expression), iVar3 != 9)))
     ) {
LAB_004bf252:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"condition must be a scalar integer expression","switch","");
  }
  else {
    iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xe8))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if (cVar2 != '\0') goto LAB_004bf252;
    iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xe0))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    if (cVar2 != '\0') goto LAB_004bf252;
    iVar3 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xd8))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    if (cVar2 != '\0') goto LAB_004bf252;
  }
  p_Var1 = (this->super_TParseContextBase).switchSequenceStack.
           super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           .
           super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  if (p_Var1[1]._M_next == p_Var1->_M_prev) {
    return &expression->super_TIntermNode;
  }
  if (lastStatements != (TIntermAggregate *)0x0) goto LAB_004bf33f;
  iVar3 = (this->super_TParseContextBase).super_TParseVersions.version;
  if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
    if ((0xffffffec < iVar3 - 0x140U) ||
       (lVar6 = 0x168,
       ((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgRelaxedErrors) !=
       EShMsgDefault)) {
LAB_004bf2d2:
      lVar6 = 0x170;
    }
  }
  else {
    lVar6 = 0x168;
    if (0xffffffe2 < iVar3 - 0x1ccU) goto LAB_004bf2d2;
  }
  (**(code **)((long)(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions +
              lVar6))(this,loc,"last case/default label not followed by statements","switch","");
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  node = TIntermediate::addBranch(this_00,EOpBreak,loc);
  pTVar4 = TIntermediate::makeAggregate(this_00,&node->super_TIntermNode);
  (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
            (pTVar4,1);
  local_30 = pTVar4;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)p_Var1,
             (TIntermNode **)&local_30);
LAB_004bf33f:
  pTVar5 = GetThreadPoolAllocator();
  pTVar4 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar5,0x188);
  TIntermAggregate::TIntermAggregate(pTVar4,EOpSequence);
  p_Var1 = (this->super_TParseContextBase).switchSequenceStack.
           super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           .
           super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar4);
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator=
            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             CONCAT44(extraout_var_02,iVar3),
             (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)p_Var1);
  (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (pTVar4,loc);
  pTVar5 = GetThreadPoolAllocator();
  this_01 = (TIntermNode *)TPoolAllocator::allocate(pTVar5,0x38);
  (this_01->loc).name = (TString *)0x0;
  *(undefined8 *)&(this_01->loc).string = 0;
  (this_01->loc).column = 0;
  this_01->_vptr_TIntermNode = (_func_int **)&PTR_getLoc_00afcf18;
  *(TIntermTyped **)(this_01 + 1) = expression;
  *(TIntermAggregate **)&this_01[1].loc = pTVar4;
  *(undefined2 *)&this_01[1].loc.string = 0;
  TIntermNode::setLoc(this_01,loc);
  return this_01;
}

Assistant:

TIntermNode* TParseContext::addSwitch(const TSourceLoc& loc, TIntermTyped* expression, TIntermAggregate* lastStatements)
{
    profileRequires(loc, EEsProfile, 300, nullptr, "switch statements");
    profileRequires(loc, ENoProfile, 130, nullptr, "switch statements");

    wrapupSwitchSubsequence(lastStatements, nullptr);

    if (expression == nullptr ||
        (expression->getBasicType() != EbtInt && expression->getBasicType() != EbtUint) ||
        expression->getType().isArray() || expression->getType().isMatrix() || expression->getType().isVector())
            error(loc, "condition must be a scalar integer expression", "switch", "");

    // If there is nothing to do, drop the switch but still execute the expression
    TIntermSequence* switchSequence = switchSequenceStack.back();
    if (switchSequence->size() == 0)
        return expression;

    if (lastStatements == nullptr) {
        // This was originally an ERRROR, because early versions of the specification said
        // "it is an error to have no statement between a label and the end of the switch statement."
        // The specifications were updated to remove this (being ill-defined what a "statement" was),
        // so, this became a warning.  However, 3.0 tests still check for the error.
        if (isEsProfile() && (version <= 300 || version >= 320) && ! relaxedErrors())
            error(loc, "last case/default label not followed by statements", "switch", "");
        else if (!isEsProfile() && (version <= 430 || version >= 460))
            error(loc, "last case/default label not followed by statements", "switch", "");
        else
            warn(loc, "last case/default label not followed by statements", "switch", "");


        // emulate a break for error recovery
        lastStatements = intermediate.makeAggregate(intermediate.addBranch(EOpBreak, loc));
        lastStatements->setOperator(EOpSequence);
        switchSequence->push_back(lastStatements);
    }

    TIntermAggregate* body = new TIntermAggregate(EOpSequence);
    body->getSequence() = *switchSequenceStack.back();
    body->setLoc(loc);

    TIntermSwitch* switchNode = new TIntermSwitch(expression, body);
    switchNode->setLoc(loc);

    return switchNode;
}